

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_concept_suite.cpp
# Opt level: O2

void container_suite::run(void)

{
  return;
}

Assistant:

void run()
{
    // [container.requirements.general]
    container_types();
    container_constructible();
    container_destructible();
    container_assignable();
    // Required member functions are checked elsewhere
    //   variable::begin()
    //   variable::end()
    //   variable::cbegin()
    //   variable::cend()
    //   variable::swap()
    //   Equality operators
    //   Capacity
}